

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O3

value_type * __thiscall
google::protobuf::
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>
::CreateValueTypeInternal
          (Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key)

{
  Arena *pAVar1;
  MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>
  *this_00;
  
  if (this->arena_ == (Arena *)0x0) {
    this_00 = (MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>
               *)operator_new(0x50);
    MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>
    ::MapPair(this_00,key);
  }
  else {
    this_00 = (MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>
               *)Arena::AllocateAligned(this->arena_,(type_info *)&unsigned_char::typeinfo,0x50);
    pAVar1 = this->arena_;
    (this_00->first)._M_dataplus._M_p = (pointer)&(this_00->first).field_2;
    (this_00->first)._M_string_length = 0;
    (this_00->first).field_2._M_local_buf[0] = '\0';
    Arena::OwnDestructor<std::__cxx11::string>
              (pAVar1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
    pAVar1 = this->arena_;
    CoreML::Specification::MILSpec::Value::Value(&this_00->second);
    Arena::OwnDestructor<CoreML::Specification::MILSpec::Value>(pAVar1,&this_00->second);
    std::__cxx11::string::_M_assign((string *)this_00);
  }
  return this_00;
}

Assistant:

value_type* CreateValueTypeInternal(const Key& key) {
    if (arena_ == NULL) {
      return new value_type(key);
    } else {
      value_type* value = reinterpret_cast<value_type*>(
          Arena::CreateArray<uint8>(arena_, sizeof(value_type)));
      Arena::CreateInArenaStorage(const_cast<Key*>(&value->first), arena_);
      Arena::CreateInArenaStorage(&value->second, arena_);
      const_cast<Key&>(value->first) = key;
      return value;
    }
  }